

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

void helicsEndpointSendString(HelicsEndpoint endpoint,char *message,HelicsError *err)

{
  Endpoint *this;
  undefined8 *puVar1;
  void *__buf;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  int in_R8D;
  bool bVar2;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (endpoint == (HelicsEndpoint)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001ade3f;
    }
    else {
      in_CL = err == (HelicsError *)0x0;
      bVar2 = *(int *)((long)endpoint + 0x20) == -0x4bac6b3e;
      puVar1 = (undefined8 *)0x0;
      if (bVar2) {
        puVar1 = (undefined8 *)endpoint;
      }
      if (bVar2 || (bool)in_CL) goto LAB_001ade41;
    }
    err->error_code = -3;
    err->message = "The given endpoint does not point to a valid object";
  }
LAB_001ade3f:
  puVar1 = (undefined8 *)0x0;
LAB_001ade41:
  if (puVar1 != (undefined8 *)0x0) {
    this = (Endpoint *)*puVar1;
    if (message == (char *)0x0) {
      helics::Endpoint::send
                (this,(int)gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 (void *)gHelicsEmptyStr_abi_cxx11_._M_string_length,
                 CONCAT71(in_register_00000009,in_CL),in_R8D);
    }
    else {
      __buf = (void *)strlen(message);
      helics::Endpoint::send(this,(int)message,__buf,CONCAT71(in_register_00000009,in_CL),in_R8D);
    }
  }
  return;
}

Assistant:

void helicsEndpointSendString(HelicsEndpoint endpoint, const char* message, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        if (message == nullptr) {
            endObj->endPtr->send(gHelicsEmptyStr);
        } else {
            endObj->endPtr->send(message);
        }
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}